

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem.cpp
# Opt level: O3

void show_mem(RK_U32 *buf,RK_S32 size)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  
  uVar3 = 0x20;
  _mpp_log_l(2,"mpp_mem","dumping buf %p size %d start\n",(char *)0x0,buf,0x20);
  do {
    if (uVar3 < 0x10) {
      if (uVar3 < 0xc) {
        if (uVar3 < 8) {
          _mpp_log_l(2,"mpp_mem","%08x\n",(char *)0x0,(ulong)*buf);
          iVar1 = -4;
          lVar2 = 4;
        }
        else {
          _mpp_log_l(2,"mpp_mem","%08x %08x\n",(char *)0x0,(ulong)*buf,(ulong)buf[1]);
          iVar1 = -8;
          lVar2 = 8;
        }
      }
      else {
        _mpp_log_l(2,"mpp_mem","%08x %08x %08x\n",(char *)0x0,(ulong)*buf,(ulong)buf[1],
                   (ulong)buf[2]);
        iVar1 = -0xc;
        lVar2 = 0xc;
      }
    }
    else {
      _mpp_log_l(2,"mpp_mem","%08x %08x %08x %08x\n",(char *)0x0,(ulong)*buf,(ulong)buf[1],
                 (ulong)buf[2],(ulong)buf[3]);
      iVar1 = -0x10;
      lVar2 = 0x10;
    }
    buf = (RK_U32 *)((long)buf + lVar2);
    uVar3 = uVar3 + iVar1;
  } while (uVar3 != 0);
  _mpp_log_l(2,"mpp_mem","dumping buf %p size %d end\n",(char *)0x0,buf,0);
  return;
}

Assistant:

static void show_mem(RK_U32 *buf, RK_S32 size)
{
    mpp_err("dumping buf %p size %d start\n", buf, size);
    while (size > 0) {
        if (size >= 16) {
            mpp_err("%08x %08x %08x %08x\n", buf[0], buf[1], buf[2], buf[3]);
            buf += 4;
            size -= 16;
        } else if (size >= 12) {
            mpp_err("%08x %08x %08x\n", buf[0], buf[1], buf[2]);
            buf += 3;
            size -= 12;
        } else if (size >= 8) {
            mpp_err("%08x %08x\n", buf[0], buf[1]);
            buf += 2;
            size -= 8;
        } else if (size >= 4) {
            mpp_err("%08x\n", buf[0]);
            buf += 1;
            size -= 4;
        } else {
            mpp_log("end with size %d\n", size);
            break;
        }
    }
    mpp_err("dumping buf %p size %d end\n", buf, size);
}